

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O0

void ERR_error_string_n(ulong e,char *buf,size_t len)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  uint32_t packed_error;
  char *last_pos;
  char *colon;
  char *s;
  uint i;
  int ret;
  char reason_buf [32];
  char lib_buf [32];
  uint *local_40;
  char *reason_str;
  char *lib_str;
  uint reason;
  uint lib;
  size_t len_local;
  char *buf_local;
  uint32_t packed_error_local;
  
  packed_error = (uint32_t)e;
  if (len != 0) {
    uVar1 = ERR_GET_LIB(packed_error);
    uVar2 = ERR_GET_REASON(packed_error);
    reason_str = err_lib_error_string(packed_error);
    local_40 = (uint *)err_reason_error_string(packed_error,0);
    if (reason_str == (char *)0x0) {
      snprintf(reason_buf + 0x18,0x20,"lib(%u)",(ulong)uVar1);
      reason_str = reason_buf + 0x18;
    }
    if (local_40 == (uint *)0x0) {
      snprintf((char *)&i,0x20,"reason(%u)",(ulong)uVar2);
      local_40 = &i;
    }
    iVar3 = snprintf(buf,len,"error:%08x:%s:OPENSSL_internal:%s",e & 0xffffffff,reason_str,local_40)
    ;
    if (((-1 < iVar3) && (len <= (ulong)(long)iVar3)) && (4 < len)) {
      colon = buf;
      for (s._0_4_ = 0; (uint)s < 4; s._0_4_ = (uint)s + 1) {
        pcVar4 = strchr(colon,0x3a);
        if ((pcVar4 == (char *)0x0) || (buf + (ulong)(uint)s + (len - 5) < pcVar4)) {
          OPENSSL_memset(buf + (ulong)(uint)s + (len - 5),0x3a,(ulong)(4 - (uint)s));
          return;
        }
        colon = pcVar4 + 1;
      }
    }
  }
  return;
}

Assistant:

char *ERR_error_string_n(uint32_t packed_error, char *buf, size_t len) {
  if (len == 0) {
    return NULL;
  }

  unsigned lib = ERR_GET_LIB(packed_error);
  unsigned reason = ERR_GET_REASON(packed_error);

  const char *lib_str = err_lib_error_string(packed_error);
  const char *reason_str = err_reason_error_string(packed_error, /*symbol=*/0);

  char lib_buf[32], reason_buf[32];
  if (lib_str == NULL) {
    snprintf(lib_buf, sizeof(lib_buf), "lib(%u)", lib);
    lib_str = lib_buf;
  }

  if (reason_str == NULL) {
    snprintf(reason_buf, sizeof(reason_buf), "reason(%u)", reason);
    reason_str = reason_buf;
  }

  int ret = snprintf(buf, len, "error:%08" PRIx32 ":%s:OPENSSL_internal:%s",
                     packed_error, lib_str, reason_str);
  if (ret >= 0 && (size_t)ret >= len) {
    // The output was truncated; make sure we always have 5 colon-separated
    // fields, i.e. 4 colons.
    static const unsigned num_colons = 4;
    unsigned i;
    char *s = buf;

    if (len <= num_colons) {
      // In this situation it's not possible to ensure that the correct number
      // of colons are included in the output.
      return buf;
    }

    for (i = 0; i < num_colons; i++) {
      char *colon = strchr(s, ':');
      char *last_pos = &buf[len - 1] - num_colons + i;

      if (colon == NULL || colon > last_pos) {
        // set colon |i| at last possible position (buf[len-1] is the
        // terminating 0). If we're setting this colon, then all whole of the
        // rest of the string must be colons in order to have the correct
        // number.
        OPENSSL_memset(last_pos, ':', num_colons - i);
        break;
      }

      s = colon + 1;
    }
  }

  return buf;
}